

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void errorlimit(FuncState *fs,int limit,char *what)

{
  char *msg;
  
  if (fs->f->linedefined == 0) {
    msg = luaO_pushfstring(fs->L,"main function has more than %d %s",limit,what);
  }
  else {
    msg = luaO_pushfstring(fs->L,"function at line %d has more than %d %s");
  }
  luaX_lexerror(fs->ls,msg,0);
}

Assistant:

static void errorlimit(FuncState*fs,int limit,const char*what){
const char*msg=(fs->f->linedefined==0)?
luaO_pushfstring(fs->L,"main function has more than %d %s",limit,what):
luaO_pushfstring(fs->L,"function at line %d has more than %d %s",
fs->f->linedefined,limit,what);
luaX_lexerror(fs->ls,msg,0);
}